

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Bech32.cpp
# Opt level: O1

void __thiscall
Bech32Test_extractHumanReadablePart_Test::~Bech32Test_extractHumanReadablePart_Test
          (Bech32Test_extractHumanReadablePart_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Bech32Test, extractHumanReadablePart) {
    std::string str("ab1cd");
    std::string hrp = extractHumanReadablePart(str);
    ASSERT_EQ(hrp, "ab");

    str = "ab1";
    hrp = extractHumanReadablePart(str);
    ASSERT_EQ(hrp, "ab");

    str = "1cd";
    hrp = extractHumanReadablePart(str);
    ASSERT_EQ(hrp, "");

    str = "1";
    hrp = extractHumanReadablePart(str);
    ASSERT_EQ(hrp, "");
}